

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int fits_is_compressed_image(fitsfile *fptr,int *status)

{
  int iVar1;
  
  if (0 < *status) {
    return 0;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1)) {
      return *status;
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  return (uint)(fptr->Fptr->compressimg != 0);
}

Assistant:

int fits_is_compressed_image(fitsfile *fptr,  /* I - FITS file pointer  */
                 int *status)                 /* IO - error status      */
/*
   Returns TRUE if the CHDU is a compressed image, else returns zero.
*/
{
    if (*status > 0)
        return(0);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        /* rescan header if data structure is undefined */
        if ( ffrdef(fptr, status) > 0)               
            return(*status);
    }

    /*  check if this is a compressed image */
    if ((fptr->Fptr)->compressimg)
         return(1);

    return(0);
}